

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_swap3d_topology.cpp
# Opt level: O2

HostFew<Omega_h::Read<int>,_4> *
Omega_h::swap3d_topology
          (HostFew<Omega_h::Read<int>,_4> *__return_storage_ptr__,Mesh *mesh,LOs *keys2edges,
          Read<signed_char> *edge_configs,HostFew<Omega_h::Read<int>,_4> *keys2prods)

{
  char cVar1;
  byte bVar2;
  Alloc *pAVar3;
  undefined8 uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  Int eev;
  size_t sVar9;
  Int pfv;
  int iVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  byte bVar16;
  Int eev_1;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  int *piVar25;
  undefined8 uStack_4a0;
  Few<int,_2> plane_edge_verts;
  Few<int,_3> new_tri_verts;
  LOs tet_verts2verts;
  LOs edge_verts2verts;
  Read<signed_char> edge_tet_codes;
  LOs edge_tets2tets;
  LOs edges2edge_tets;
  Loop loop;
  string local_388;
  Write<int> local_368;
  Write<int> local_358;
  Write<signed_char> local_348;
  Write<int> local_338;
  Write<int> local_328;
  HostFew<Omega_h::Read<int>,_4> local_318;
  HostFew<Omega_h::Write<int>,_4> local_2d8;
  HostFew<Omega_h::Write<int>,_4> prod_verts2verts_w;
  Write<int> local_250;
  Adj edges2tets;
  Write<int> local_210;
  Write<signed_char> local_200;
  Write<int> local_1f0;
  Write<int> local_1e0;
  Write<signed_char> local_1d0;
  Write<int> local_1c0;
  Write<int> local_1b0;
  HostFew<Omega_h::Read<int>,_4> local_1a0;
  HostFew<Omega_h::Write<int>,_4> local_160;
  type f;
  
  Mesh::ask_up(&edges2tets,mesh,1,3);
  Write<int>::Write(&edges2edge_tets.write_,(Write<int> *)&edges2tets);
  Write<int>::Write(&edge_tets2tets.write_,&edges2tets.super_Graph.ab2b.write_);
  Write<signed_char>::Write(&edge_tet_codes.write_,&edges2tets.codes.write_);
  Mesh::ask_verts_of((Mesh *)&edge_verts2verts,(Int)mesh);
  Mesh::ask_verts_of((Mesh *)&tet_verts2verts,(Int)mesh);
  prod_verts2verts_w.array_[3].shared_alloc_.alloc = (Alloc *)0x0;
  prod_verts2verts_w.array_[3].shared_alloc_.direct_ptr = (void *)0x0;
  prod_verts2verts_w.array_[2].shared_alloc_.alloc = (Alloc *)0x0;
  prod_verts2verts_w.array_[2].shared_alloc_.direct_ptr = (void *)0x0;
  prod_verts2verts_w.array_[1].shared_alloc_.alloc = (Alloc *)0x0;
  prod_verts2verts_w.array_[1].shared_alloc_.direct_ptr = (void *)0x0;
  prod_verts2verts_w.array_[0].shared_alloc_.alloc = (Alloc *)0x0;
  prod_verts2verts_w.array_[0].shared_alloc_.direct_ptr = (void *)0x0;
  iVar22 = 2;
  for (lVar11 = 0x10; lVar11 != 0x40; lVar11 = lVar11 + 0x10) {
    iVar8 = Read<int>::last((Read<signed_char> *)
                            ((long)&keys2prods->array_[0].write_.shared_alloc_.alloc + lVar11));
    std::__cxx11::string::string((string *)&local_388,"",(allocator *)&f);
    Write<int>::Write(&local_210,iVar8 * iVar22,&local_388);
    Write<int>::operator=
              ((Write<int> *)((long)&prod_verts2verts_w.array_[0].shared_alloc_.alloc + lVar11),
               &local_210);
    Write<int>::~Write(&local_210);
    std::__cxx11::string::~string((string *)&local_388);
    iVar22 = iVar22 + 1;
  }
  pAVar3 = (keys2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar9 = pAVar3->size;
  }
  else {
    sVar9 = (ulong)pAVar3 >> 3;
  }
  Write<int>::Write((Write<int> *)&f,&keys2edges->write_);
  Write<signed_char>::Write(&f.edge_configs.write_,&edge_configs->write_);
  Write<int>::Write(&f.edges2edge_tets.write_,&edges2edge_tets.write_);
  Write<int>::Write(&f.edge_tets2tets.write_,&edge_tets2tets.write_);
  Write<signed_char>::Write(&f.edge_tet_codes.write_,&edge_tet_codes.write_);
  Write<int>::Write(&f.edge_verts2verts.write_,&edge_verts2verts.write_);
  Write<int>::Write(&f.tet_verts2verts.write_,&tet_verts2verts.write_);
  HostFew<Omega_h::Read<int>,_4>::HostFew(&f.keys2prods,keys2prods);
  HostFew<Omega_h::Write<int>,_4>::HostFew(&f.prod_verts2verts_w,&prod_verts2verts_w);
  Write<int>::Write(&local_210,(Write<int> *)&f);
  Write<signed_char>::Write(&local_200,&f.edge_configs.write_);
  Write<int>::Write(&local_1f0,&f.edges2edge_tets.write_);
  Write<int>::Write(&local_1e0,&f.edge_tets2tets.write_);
  Write<signed_char>::Write(&local_1d0,&f.edge_tet_codes.write_);
  Write<int>::Write(&local_1c0,&f.edge_verts2verts.write_);
  Write<int>::Write(&local_1b0,&f.tet_verts2verts.write_);
  HostFew<Omega_h::Read<int>,_4>::HostFew(&local_1a0,&f.keys2prods);
  HostFew<Omega_h::Write<int>,_4>::HostFew(&local_160,&f.prod_verts2verts_w);
  uVar19 = (uint)(sVar9 >> 2);
  if (0 < (int)uVar19) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&local_388,&local_210);
    Write<signed_char>::Write((Write<signed_char> *)&local_388.field_2,&local_200);
    Write<int>::Write(&local_368,&local_1f0);
    Write<int>::Write(&local_358,&local_1e0);
    Write<signed_char>::Write(&local_348,&local_1d0);
    Write<int>::Write(&local_338,&local_1c0);
    Write<int>::Write(&local_328,&local_1b0);
    HostFew<Omega_h::Read<int>,_4>::HostFew(&local_318,&local_1a0);
    HostFew<Omega_h::Write<int>,_4>::HostFew(&local_2d8,&local_160);
    entering_parallel = 0;
    for (uVar18 = 0; pvVar7 = local_328.shared_alloc_.direct_ptr,
        pvVar6 = local_348.shared_alloc_.direct_ptr, pvVar5 = local_358.shared_alloc_.direct_ptr,
        uVar18 != (uVar19 & 0x7fffffff); uVar18 = uVar18 + 1) {
      iVar22 = *(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                               local_388._M_string_length)->_M_ptr + uVar18 * 4);
      lVar11 = (long)iVar22;
      cVar1 = *(char *)(local_388.field_2._8_8_ + lVar11);
      lVar13 = (long)*(int *)((long)&(((Graph *)local_368.shared_alloc_.direct_ptr)->a2ab).write_.
                                     shared_alloc_.alloc + lVar11 * 4);
      uVar15 = *(int *)((long)&(((Graph *)local_368.shared_alloc_.direct_ptr)->a2ab).write_.
                               shared_alloc_.alloc + lVar11 * 4 + 4) - lVar13;
      iVar8 = (int)uVar15;
      loop.size = iVar8;
      if (iVar8 < 8) {
        if (iVar8 < 3) {
          uStack_4a0 = 0x20;
          pcVar14 = "loop.size >= 3";
LAB_0034c232:
          fail("assertion %s failed at %s +%d\n",pcVar14,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_swap3d_loop.hpp"
               ,uStack_4a0);
        }
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          loop.eev2v.array_[lVar11] =
               *(int *)((long)&(((Graph *)local_338.shared_alloc_.direct_ptr)->a2ab).write_.
                               shared_alloc_.alloc + lVar11 * 4 + (long)(iVar22 * 2) * 4);
        }
        for (lVar11 = 0; lVar11 != 7; lVar11 = lVar11 + 1) {
          (new_tri_verts.array_ + lVar11 * 2)[0] = -1;
          (new_tri_verts.array_ + lVar11 * 2)[1] = -1;
        }
        piVar25 = new_tri_verts.array_;
        for (uVar21 = 0; uVar21 != (uVar15 & 0xffffffff); uVar21 = uVar21 + 1) {
          lVar11 = lVar13 + uVar21;
          bVar2 = *(byte *)((long)&(((Graph *)pvVar6)->a2ab).write_.shared_alloc_.alloc + lVar11);
          bVar16 = (char)bVar2 >> 3;
          uVar12 = 0xffffffff;
          if (bVar16 < 6) {
            uVar12 = *(uint *)(&DAT_00377b68 + (ulong)bVar16 * 4);
          }
          iVar22 = *(int *)((long)&(((Graph *)pvVar5)->a2ab).write_.shared_alloc_.alloc + lVar11 * 4
                           );
          uVar23 = bVar2 >> 1 & 3;
          uVar20 = (ulong)uVar23;
          for (uVar24 = 0; uVar24 != 2; uVar24 = uVar24 + 1) {
            iVar10 = -1;
            if (5 < uVar12) goto LAB_0034c08c;
            uVar17 = (uint)uVar24 ^ uVar23;
            switch(uVar12) {
            case 0:
              if (uVar20 == uVar24) {
LAB_0034c057:
                iVar10 = 0;
              }
              else {
                iVar10 = (uint)(uVar17 == 1) * 2 + -1;
              }
              break;
            case 1:
              iVar10 = 1;
              if (uVar20 != uVar24) {
                iVar10 = (uint)(uVar17 == 1) * 3 + -1;
              }
              break;
            case 2:
              iVar10 = 2;
              if (uVar20 != uVar24) {
                iVar10 = -(uint)(uVar17 != 1);
              }
              break;
            case 3:
              if (uVar20 == uVar24) goto LAB_0034c057;
              goto LAB_0034c07b;
            case 4:
              iVar10 = 1;
              goto LAB_0034c075;
            case 5:
              iVar10 = 2;
LAB_0034c075:
              if (uVar20 != uVar24) {
LAB_0034c07b:
                iVar10 = (uint)(uVar17 == 1) * 4 + -1;
              }
            }
LAB_0034c08c:
            piVar25[uVar24] =
                 *(int *)((long)&(&((Graph *)pvVar7)->a2ab)[iVar22].write_.shared_alloc_.alloc +
                         (long)iVar10 * 4);
          }
          piVar25 = piVar25 + 2;
        }
        uVar21 = 1;
        uVar24 = 0;
        while (uVar24 != iVar8 - 1) {
          uVar20 = uVar21;
          while( true ) {
            if (iVar8 <= (int)uVar20) {
              pcVar14 = "j < loop.size";
              uStack_4a0 = 0x47;
              goto LAB_0034c232;
            }
            if (new_tri_verts.array_[uVar20 * 2] == new_tri_verts.array_[uVar24 * 2 + 1]) break;
            uVar20 = uVar20 + 1;
          }
          uVar4 = *(undefined8 *)(new_tri_verts.array_ + uVar24 * 2 + 2);
          *(undefined8 *)(new_tri_verts.array_ + uVar24 * 2 + 2) =
               *(undefined8 *)(new_tri_verts.array_ + (uVar20 & 0xffffffff) * 2);
          *(undefined8 *)(new_tri_verts.array_ + (uVar20 & 0xffffffff) * 2) = uVar4;
          uVar21 = uVar21 + 1;
          uVar24 = uVar24 + 1;
        }
        for (uVar21 = 0; (uVar15 & 0xffffffff) != uVar21; uVar21 = uVar21 + 1) {
          loop.loop_verts2verts.array_[uVar21] = new_tri_verts.array_[uVar21 * 2];
        }
      }
      uVar12 = *(uint *)(swap3d::swap_mesh_sizes + uVar15 * 4);
      uVar21 = (ulong)uVar12;
      uVar23 = *(uint *)(swap3d::nedges + uVar15 * 4);
      iVar22 = 0;
      uVar24 = 0;
      if (0 < (int)uVar23) {
        uVar24 = (ulong)uVar23;
      }
      for (uVar20 = 0; uVar20 != uVar24; uVar20 = uVar20 + 1) {
        iVar8 = *(int *)(*(long *)(*(long *)(swap3d::edges2unique + uVar15 * 8) + (long)cVar1 * 8) +
                        uVar20 * 4);
        lVar11 = *(long *)(swap3d::unique_edges + uVar15 * 8);
        for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
          plane_edge_verts.array_[lVar13] =
               loop.loop_verts2verts.array_[*(int *)((long)iVar8 * 8 + lVar11 + lVar13 * 4)];
        }
        iVar8 = *(int *)((long)&(((Graph *)local_318.array_[1].write_.shared_alloc_.direct_ptr)->
                                a2ab).write_.shared_alloc_.alloc + uVar18 * 4);
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          *(int *)((long)&(((Graph *)local_2d8.array_[1].shared_alloc_.direct_ptr)->a2ab).write_.
                          shared_alloc_.alloc + lVar11 * 4 + (long)((iVar8 + (int)uVar20) * 2) * 4)
               = plane_edge_verts.array_[lVar11];
        }
        iVar8 = iVar22;
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
            new_tri_verts.array_[lVar13] = plane_edge_verts.array_[lVar13];
          }
          new_tri_verts.array_[2] = loop.eev2v.array_[lVar11];
          iVar10 = *(int *)((long)&(((Graph *)local_318.array_[2].write_.shared_alloc_.direct_ptr)->
                                   a2ab).write_.shared_alloc_.alloc + uVar18 * 4);
          for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
            *(int *)((long)&(((Graph *)local_2d8.array_[2].shared_alloc_.direct_ptr)->a2ab).write_.
                            shared_alloc_.alloc + lVar13 * 4 + (long)((iVar10 + iVar8) * 3) * 4) =
                 new_tri_verts.array_[lVar13];
          }
          iVar8 = iVar8 + 1;
        }
        iVar22 = iVar22 + 2;
      }
      iVar22 = uVar23 * 2;
      if ((int)uVar12 < 1) {
        uVar21 = 0;
      }
      for (uVar24 = 0; uVar24 != uVar21; uVar24 = uVar24 + 1) {
        iVar8 = *(int *)(uVar24 * 4 + *(long *)(swap3d::swap_meshes + uVar15 * 8) +
                        (long)(int)((int)cVar1 * uVar12) * 4);
        lVar11 = *(long *)(swap3d::swap_triangles + uVar15 * 8);
        for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
          plane_edge_verts.array_[lVar13] =
               loop.loop_verts2verts.array_[*(int *)((long)iVar8 * 0xc + lVar11 + lVar13 * 4)];
        }
        iVar8 = *(int *)((long)&(((Graph *)local_318.array_[2].write_.shared_alloc_.direct_ptr)->
                                a2ab).write_.shared_alloc_.alloc + uVar18 * 4);
        for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
          *(int *)((long)&(((Graph *)local_2d8.array_[2].shared_alloc_.direct_ptr)->a2ab).write_.
                          shared_alloc_.alloc + lVar11 * 4 + (long)((iVar8 + iVar22) * 3) * 4) =
               plane_edge_verts.array_[lVar11];
        }
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          iVar8 = *(int *)((long)&(((Graph *)local_318.array_[3].write_.shared_alloc_.direct_ptr)->
                                  a2ab).write_.shared_alloc_.alloc + uVar18 * 4);
          for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
            new_tri_verts.array_[lVar13] = plane_edge_verts.array_[lVar13];
          }
          if (lVar11 == 0) {
            iVar10 = new_tri_verts.array_[1];
            new_tri_verts.array_[1] = new_tri_verts.array_[2];
            new_tri_verts.array_[2] = iVar10;
          }
          for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
            *(int *)((long)&(((Graph *)local_2d8.array_[3].shared_alloc_.direct_ptr)->a2ab).write_.
                            shared_alloc_.alloc +
                    lVar13 * 4 + (long)(int)((iVar8 + ((uint)lVar11 | (int)uVar24 * 2)) * 4) * 4) =
                 new_tri_verts.array_[lVar13];
          }
        }
        iVar22 = iVar22 + 1;
      }
    }
    swap3d_topology(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::HostFew<Omega_h::Read<int>,4>)
    ::$_0::~__0((__0 *)&local_388);
  }
  swap3d_topology(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::HostFew<Omega_h::Read<int>,4>)
  ::$_0::~__0((__0 *)&local_210);
  __return_storage_ptr__->array_[3].write_.shared_alloc_ = (SharedAlloc)0x0;
  __return_storage_ptr__->array_[2].write_.shared_alloc_ = (SharedAlloc)0x0;
  __return_storage_ptr__->array_[1].write_.shared_alloc_ = (SharedAlloc)0x0;
  __return_storage_ptr__->array_[0].write_.shared_alloc_ = (SharedAlloc)0x0;
  for (lVar11 = 0x10; lVar11 != 0x40; lVar11 = lVar11 + 0x10) {
    Write<int>::Write(&local_250,
                      (Write<int> *)
                      ((long)&prod_verts2verts_w.array_[0].shared_alloc_.alloc + lVar11));
    Read<int>::Read((Read<signed_char> *)&local_388,&local_250);
    Write<int>::operator=
              ((Write<int> *)
               ((long)&__return_storage_ptr__->array_[0].write_.shared_alloc_.alloc + lVar11),
               (Write<int> *)&local_388);
    Write<int>::~Write((Write<int> *)&local_388);
    Write<int>::~Write(&local_250);
  }
  swap3d_topology(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::HostFew<Omega_h::Read<int>,4>)
  ::$_0::~__0((__0 *)&f);
  HostFew<Omega_h::Write<int>,_4>::~HostFew(&prod_verts2verts_w);
  Write<int>::~Write(&tet_verts2verts.write_);
  Write<int>::~Write(&edge_verts2verts.write_);
  Write<signed_char>::~Write(&edge_tet_codes.write_);
  Write<int>::~Write(&edge_tets2tets.write_);
  Write<int>::~Write(&edges2edge_tets.write_);
  Adj::~Adj(&edges2tets);
  return __return_storage_ptr__;
}

Assistant:

HostFew<LOs, 4> swap3d_topology(Mesh* mesh, LOs keys2edges,
    Read<I8> edge_configs, HostFew<LOs, 4> keys2prods) {
  auto edges2tets = mesh->ask_up(EDGE, REGION);
  auto edges2edge_tets = edges2tets.a2ab;
  auto edge_tets2tets = edges2tets.ab2b;
  auto edge_tet_codes = edges2tets.codes;
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto tet_verts2verts = mesh->ask_verts_of(REGION);
  HostFew<Write<LO>, 4> prod_verts2verts_w;
  for (Int prod_dim = EDGE; prod_dim <= REGION; ++prod_dim) {
    prod_verts2verts_w[prod_dim] =
        Write<LO>(keys2prods[prod_dim].last() * Int(prod_dim + 1));
  }
  auto nkeys = keys2edges.size();
  auto f = OMEGA_H_LAMBDA(LO key) {
    auto edge = keys2edges[key];
    auto config = edge_configs[edge];
    auto loop = swap3d::find_loop(edges2edge_tets, edge_tets2tets,
        edge_tet_codes, edge_verts2verts, tet_verts2verts, edge);
    auto nplane_tris = swap3d::swap_mesh_sizes[loop.size];
    auto nplane_edges = swap3d::nedges[loop.size];
    for (Int plane_edge = 0; plane_edge < nplane_edges; ++plane_edge) {
      auto unique_edge = swap3d::edges2unique[loop.size][config][plane_edge];
      Few<LO, 2> plane_edge_verts;
      for (Int pev = 0; pev < 2; ++pev) {
        auto loop_vert = swap3d::unique_edges[loop.size][unique_edge][pev];
        auto vert = loop.loop_verts2verts[loop_vert];
        plane_edge_verts[pev] = vert;
      }
      auto prod_edge = keys2prods[EDGE][key] + plane_edge;
      for (Int pev = 0; pev < 2; ++pev) {
        prod_verts2verts_w[EDGE][prod_edge * 2 + pev] = plane_edge_verts[pev];
      }
      for (Int eev = 0; eev < 2; ++eev) {
        Few<LO, 3> new_tri_verts;
        for (Int nfv = 0; nfv < 2; ++nfv) {
          new_tri_verts[nfv] = plane_edge_verts[nfv];
        }
        new_tri_verts[2] = loop.eev2v[eev];
        auto prod_tri = keys2prods[FACE][key] + 2 * plane_edge + eev;
        for (Int nfv = 0; nfv < 3; ++nfv) {
          prod_verts2verts_w[FACE][prod_tri * 3 + nfv] = new_tri_verts[nfv];
        }
      }
    }
    for (Int plane_tri = 0; plane_tri < nplane_tris; ++plane_tri) {
      auto uniq_tri =
          swap3d::swap_meshes[loop.size][config * nplane_tris + plane_tri];
      Few<LO, 3> plane_tri_verts;
      for (Int pfv = 0; pfv < 3; ++pfv) {
        auto loop_vert = swap3d::swap_triangles[loop.size][uniq_tri][pfv];
        auto vert = loop.loop_verts2verts[loop_vert];
        plane_tri_verts[pfv] = vert;
      }
      auto prod_tri = keys2prods[FACE][key] + 2 * nplane_edges + plane_tri;
      for (Int pfv = 0; pfv < 3; ++pfv) {
        prod_verts2verts_w[FACE][prod_tri * 3 + pfv] = plane_tri_verts[pfv];
      }
      for (Int eev = 0; eev < 2; ++eev) {
        auto prod_tet = keys2prods[REGION][key] + 2 * plane_tri + eev;
        Few<LO, 4> new_tet_verts;
        for (Int pfv = 0; pfv < 3; ++pfv) {
          new_tet_verts[pfv] = plane_tri_verts[pfv];
        }
        if (eev == 0) swap2(new_tet_verts[1], new_tet_verts[2]);
        new_tet_verts[3] = loop.eev2v[eev];
        for (Int nrv = 0; nrv < 4; ++nrv) {
          prod_verts2verts_w[REGION][prod_tet * 4 + nrv] = new_tet_verts[nrv];
        }
      }
    }
  };
  parallel_for(nkeys, f, "swap3d_topology");
  HostFew<LOs, 4> prod_verts2verts;
  for (Int prod_dim = EDGE; prod_dim <= REGION; ++prod_dim) {
    prod_verts2verts[prod_dim] = prod_verts2verts_w[prod_dim];
  }
  return prod_verts2verts;
}